

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

bool __thiscall Database::can_acquire(Database *this,DatabaseLock *newlock)

{
  bool bVar1;
  __node_base *p_Var2;
  
  p_Var2 = &(this->tasks)._M_h._M_before_begin;
  do {
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) break;
    bVar1 = TaskSpec::has_lock(*(TaskSpec **)
                                &((_Prime_rehash_policy *)(p_Var2 + 2))->_M_max_load_factor,newlock)
    ;
  } while (!bVar1);
  return p_Var2 == (__node_base *)0x0;
}

Assistant:

bool Database::can_acquire(const DatabaseLock &newlock) const {
    for (const auto &[k, task] : tasks) {
        if (task->has_lock(newlock)) {
            return false;
        }
    }
    return true;
}